

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddLibraryRuntimeInfo(cmComputeLinkInformation *this,string *fullPath)

{
  cmMakefile *this_00;
  bool bVar1;
  long lVar2;
  pointer pcVar3;
  optional<cmGlobalGenerator::FrameworkDescriptor> local_128;
  int local_9c;
  undefined1 local_98 [8];
  string soname;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string file;
  bool is_shared_library;
  string *fullPath_local;
  cmComputeLinkInformation *this_local;
  
  file.field_2._M_local_buf[0xf] = '\0';
  cmsys::SystemTools::GetFilenameName((string *)local_40,fullPath);
  this_00 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_61);
  bVar1 = cmMakefile::IsOn(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_98);
    bVar1 = cmSystemTools::GuessLibraryInstallName(fullPath,(string *)local_98);
    if (bVar1) {
      lVar2 = std::__cxx11::string::find(local_98,0x1158fc4);
      if (lVar2 == -1) {
        local_9c = 1;
      }
      else {
        local_9c = 0;
      }
    }
    else {
      local_9c = 1;
    }
    std::__cxx11::string::~string((string *)local_98);
    if (local_9c != 0) goto LAB_008a4c5e;
  }
  file.field_2._M_local_buf[0xf] =
       cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,(string *)local_40);
  if (((!(bool)file.field_2._M_local_buf[0xf]) && ((this->ArchivesMayBeShared & 1U) != 0)) &&
     (bVar1 = cmsys::RegularExpression::find(&this->ExtractStaticLibraryName,(string *)local_40),
     bVar1)) {
    file.field_2._M_local_buf[0xf] = '\x01';
  }
  if ((file.field_2._M_local_buf[0xf] & 1U) == 0) {
    cmGlobalGenerator::SplitFrameworkPath(&local_128,this->GlobalGenerator,fullPath,Strict);
    file.field_2._M_local_buf[0xf] =
         std::optional<cmGlobalGenerator::FrameworkDescriptor>::has_value(&local_128);
    std::optional<cmGlobalGenerator::FrameworkDescriptor>::~optional(&local_128);
  }
  if ((file.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_9c = 1;
  }
  else {
    pcVar3 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
             operator->(&this->OrderRuntimeSearchPath);
    cmOrderDirectories::AddRuntimeLibrary(pcVar3,fullPath,(char *)0x0);
    if ((this->LinkWithRuntimePath & 1U) != 0) {
      pcVar3 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
               operator->(&this->OrderLinkerSearchPath);
      cmOrderDirectories::AddRuntimeLibrary(pcVar3,fullPath,(char *)0x0);
    }
    local_9c = 0;
  }
LAB_008a4c5e:
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmComputeLinkInformation::AddLibraryRuntimeInfo(
  std::string const& fullPath)
{
  // Get the name of the library from the file name.
  bool is_shared_library = false;
  std::string file = cmSystemTools::GetFilenameName(fullPath);

  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    // Check that @rpath is part of the install name.
    // If it isn't, return.
    std::string soname;
    if (!cmSystemTools::GuessLibraryInstallName(fullPath, soname)) {
      return;
    }

    if (soname.find("@rpath") == std::string::npos) {
      return;
    }
  }

  is_shared_library = this->ExtractSharedLibraryName.find(file);

  if (!is_shared_library) {
    // On some platforms (AIX) a shared library may look static.
    if (this->ArchivesMayBeShared) {
      if (this->ExtractStaticLibraryName.find(file)) {
        // This is the name of a shared library or archive.
        is_shared_library = true;
      }
    }
  }

  // It could be an Apple framework
  if (!is_shared_library) {
    is_shared_library =
      this->GlobalGenerator
        ->SplitFrameworkPath(fullPath,
                             cmGlobalGenerator::FrameworkFormat::Strict)
        .has_value();
  }

  if (!is_shared_library) {
    return;
  }

  // Include this library in the runtime path ordering.
  this->OrderRuntimeSearchPath->AddRuntimeLibrary(fullPath);
  if (this->LinkWithRuntimePath) {
    this->OrderLinkerSearchPath->AddRuntimeLibrary(fullPath);
  }
}